

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFEmitter.cpp
# Opt level: O0

void llvm::DWARFYAML::EmitDebugRanges(raw_ostream *OS,Data *DI)

{
  bool bVar1;
  reference pRVar2;
  Range Range;
  const_iterator __end1;
  const_iterator __begin1;
  vector<llvm::DWARFYAML::Range,_std::allocator<llvm::DWARFYAML::Range>_> *__range1;
  Data *DI_local;
  raw_ostream *OS_local;
  
  __end1 = std::vector<llvm::DWARFYAML::Range,_std::allocator<llvm::DWARFYAML::Range>_>::begin
                     (&DI->Ranges);
  Range.SectionIndex =
       (uint64_t)
       std::vector<llvm::DWARFYAML::Range,_std::allocator<llvm::DWARFYAML::Range>_>::end
                 (&DI->Ranges);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_llvm::DWARFYAML::Range_*,_std::vector<llvm::DWARFYAML::Range,_std::allocator<llvm::DWARFYAML::Range>_>_>
                                *)&Range.SectionIndex);
    if (!bVar1) break;
    pRVar2 = __gnu_cxx::
             __normal_iterator<const_llvm::DWARFYAML::Range_*,_std::vector<llvm::DWARFYAML::Range,_std::allocator<llvm::DWARFYAML::Range>_>_>
             ::operator*(&__end1);
    Range.Start = pRVar2->End;
    Range.End = pRVar2->SectionIndex;
    writeInteger<unsigned_int>((uint)pRVar2->Start,OS,(bool)(DI->IsLittleEndian & 1));
    writeInteger<unsigned_int>((uint)Range.Start,OS,(bool)(DI->IsLittleEndian & 1));
    __gnu_cxx::
    __normal_iterator<const_llvm::DWARFYAML::Range_*,_std::vector<llvm::DWARFYAML::Range,_std::allocator<llvm::DWARFYAML::Range>_>_>
    ::operator++(&__end1);
  }
  return;
}

Assistant:

void DWARFYAML::EmitDebugRanges(raw_ostream &OS, const DWARFYAML::Data &DI) {
  // As DwarfStreamer.cpp says, "The debug_range section
  // format is totally trivial, consisting just of pairs of address
  // sized addresses describing the ranges." and apparently it ends
  // with a null termination of a pair of zeros
  for (auto Range : DI.Ranges) {
    writeInteger((uint32_t)Range.Start, OS, DI.IsLittleEndian);
    writeInteger((uint32_t)Range.End, OS, DI.IsLittleEndian);
  }
}